

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

ai_real __thiscall Assimp::Discreet3DSImporter::ParsePercentageChunk(Discreet3DSImporter *this)

{
  ushort uVar1;
  float fVar2;
  Chunk local_1e;
  Discreet3DSImporter *pDStack_18;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_18 = this;
  ReadChunk(this,&local_1e);
  if (local_1e.Flag == 0x31) {
    fVar2 = StreamReader<false,_false>::GetF4(this->stream);
    this_local._4_4_ = (fVar2 * 100.0) / 65535.0;
  }
  else if (local_1e.Flag == 0x30) {
    uVar1 = StreamReader<false,_false>::GetI2(this->stream);
    this_local._4_4_ = (float)uVar1 / 65535.0;
  }
  else {
    this_local._4_4_ = get_qnan();
  }
  return this_local._4_4_;
}

Assistant:

ai_real Discreet3DSImporter::ParsePercentageChunk() {
    Discreet3DS::Chunk chunk;
    ReadChunk(&chunk);

    if (Discreet3DS::CHUNK_PERCENTF == chunk.Flag) {
        return stream->GetF4() * ai_real(100) / ai_real(0xFFFF);
    } else if (Discreet3DS::CHUNK_PERCENTW == chunk.Flag) {
        return (ai_real)((uint16_t)stream->GetI2()) / (ai_real)0xFFFF;
    }

    return get_qnan();
}